

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O0

void __thiscall QJsonValue::QJsonValue(QJsonValue *this,double v)

{
  double in_RDI;
  
  doubleValueHelper(in_RDI);
  return;
}

Assistant:

QJsonValue::QJsonValue(double v)
    : value(doubleValueHelper(v))
{
}